

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O0

ebml_element * EBML_FindNextId(stream *Input,ebml_context *Context,size_t MaxDataSize)

{
  long lVar1;
  byte bVar2;
  ebml_element *Result;
  ulong uStack_78;
  uint8_t PossibleSizeLength;
  size_t _SizeLength;
  long lStack_68;
  int8_t PossibleID_Length;
  bool_t bElementFound;
  uint8_t PossibleSize [8];
  uint8_t PossibleId [4];
  uint8_t BitMask;
  int ReadSize;
  filepos_t SizeUnknown;
  filepos_t SizeFound;
  filepos_t aSizePosition;
  filepos_t aElementPosition;
  size_t MaxDataSize_local;
  ebml_context *Context_local;
  stream *Input_local;
  
  SizeUnknown = 0;
  stack0xffffffffffffffb8 = 8;
  lStack_68 = 0;
  _SizeLength._7_1_ = '\0';
  uStack_78 = 0;
  Result._7_1_ = 0;
  do {
    if (lStack_68 != 0) {
      Input_local = (stream *)
                    CreateElement(Input,PossibleSize,_SizeLength._7_1_,Context,(ebml_master *)0x0,-1
                                 );
      if (Input_local == (stream *)0x0) {
        __assert_fail("Result != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                      ,0x162,
                      "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)"
                     );
      }
      *(byte *)((long)Input_local->URL + 0x44) = Result._7_1_;
      *(filepos_t *)((long)Input_local->URL + 0x18) = SizeUnknown;
      if (Input_local != (stream *)0x0) {
        lVar1 = (**(code **)((long)(((nodetree *)&Input_local->Base)->Base).VMT + 0x70))
                          (Input_local);
        if ((lVar1 == 0) ||
           ((SizeUnknown != stack0xffffffffffffffb8 &&
            (MaxDataSize < *(ulong *)((long)Input_local->URL + 0x18))))) {
          NodeDelete((node *)Input_local);
          Input_local = (stream *)0x0;
        }
        else {
          *(filepos_t *)((long)Input_local->URL + 0x20) = aSizePosition;
          *(filepos_t *)((long)Input_local->URL + 0x28) = SizeFound;
          *(ulong *)((long)Input_local->URL + 0x30) = SizeFound + uStack_78 + SizeUnknown;
        }
        return (ebml_element *)Input_local;
      }
      __assert_fail("(const void*)(Result)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                    ,0x16f,
                    "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)");
    }
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                    ,0x13d,
                    "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)");
    }
    aSizePosition = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
    stack0xffffffffffffffb4 = 0;
    PossibleSize[4] = 0x80;
    while( true ) {
      if (Input == (stream *)0x0) {
        __assert_fail("(const void*)(Input)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                      ,0x142,
                      "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)"
                     );
      }
      lVar1 = (**(code **)((long)(Input->Base).VMT + 0x60))
                        (Input,PossibleSize + _SizeLength._7_1_,1,0);
      if (lVar1 != 0) goto LAB_00118606;
      register0x00000000 = stack0xffffffffffffffb4 + 1;
      if (register0x00000000 == _SizeLength._7_1_) {
        return (ebml_element *)0x0;
      }
      _SizeLength._7_1_ = _SizeLength._7_1_ + '\x01';
      if ('\x04' < _SizeLength._7_1_) {
        return (ebml_element *)0x0;
      }
      if ((PossibleSize[0] & PossibleSize[4]) != 0) break;
      PossibleSize[4] = (uint8_t)((int)(uint)PossibleSize[4] >> 1);
    }
    lStack_68 = 1;
LAB_00118606:
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                    ,0x152,
                    "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)");
    }
    SizeFound = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
    do {
      if (7 < Result._7_1_) {
        return (ebml_element *)0x0;
      }
      if (Input == (stream *)0x0) {
        __assert_fail("(const void*)(Input)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                      ,0x158,
                      "ebml_element *EBML_FindNextId(struct stream *, const ebml_context *, size_t)"
                     );
      }
      bVar2 = Result._7_1_ + 1;
      lVar1 = (**(code **)((long)(Input->Base).VMT + 0x60))
                        (Input,(long)&bElementFound + (ulong)Result._7_1_ + 7,1);
      Result._7_1_ = bVar2;
      if (lVar1 != 0) break;
      register0x00000000 = stack0xffffffffffffffb4 + 1;
      uStack_78 = (ulong)bVar2;
      SizeUnknown = EBML_ReadCodedSizeValue
                              ((uint8_t *)((long)&bElementFound + 7),&stack0xffffffffffffff88,
                               (filepos_t *)(PossibleId + 1));
    } while (uStack_78 == 0);
  } while( true );
}

Assistant:

ebml_element *EBML_FindNextId(struct stream *Input, const ebml_context *Context, size_t MaxDataSize)
{
    filepos_t aElementPosition, aSizePosition;
    filepos_t SizeFound=0, SizeUnknown=8;
    int ReadSize;
    uint8_t BitMask;
    uint8_t PossibleId[4];
    uint8_t PossibleSize[8]; // we don't support size stored in more than 64 bits
    bool_t bElementFound = 0;
    int8_t PossibleID_Length = 0;
    size_t _SizeLength=0;
    uint8_t PossibleSizeLength = 0;
    ebml_element *Result = NULL;

    while (!bElementFound)
    {
        aElementPosition = Stream_Seek(Input,0,SEEK_CUR);
        ReadSize = 0;
        BitMask = 1 << 7;
        for (;;)
        {
            if (Stream_ReadOneOrMore(Input,&PossibleId[PossibleID_Length], 1, NULL)!=ERR_NONE)
                break;
            ReadSize++;
            if (ReadSize == PossibleID_Length)
                return NULL; // No more data ?
            if (++PossibleID_Length > 4)
                return NULL; // we don't support element IDs over class D
            if (PossibleId[0] & BitMask)
            {
                bElementFound = 1;
                break;
            }
            BitMask >>= 1;
        }

        // read the data size
        aSizePosition = Stream_Seek(Input,0,SEEK_CUR);
        do {
            if (PossibleSizeLength >= 8)
                // Size is larger than 8 bytes
                return NULL;

            if (Stream_ReadOneOrMore(Input,&PossibleSize[PossibleSizeLength++], 1, NULL)!=ERR_NONE)
                break;
            ReadSize++;
            _SizeLength = PossibleSizeLength;
            SizeFound = EBML_ReadCodedSizeValue(&PossibleSize[0], &_SizeLength, &SizeUnknown);
        } while (_SizeLength == 0);
    }

    // look for the ID in the provided context
    Result = CreateElement(Input, PossibleId, PossibleID_Length, Context,NULL, EBML_ANY_PROFILE);
    assert(Result != NULL);
#if 0
if (PossibleID_Length==4)
printf("Elt: size %d id %d %02X%02X%02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1],PossibleId[2],PossibleId[3]);
else if (PossibleID_Length==3)
printf("Elt: size %d id %d %02X%02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1],PossibleId[2]);
else if (PossibleID_Length==2)
printf("Elt: size %d id %d %02X%02X\n",SizeFound,PossibleID_Length,PossibleId[0],PossibleId[1]);
else if (PossibleID_Length==1)
printf("Elt: size %d id %d %02X\n",SizeFound,PossibleID_Length,PossibleId[0]);
#endif
    Result->SizeLength = PossibleSizeLength;
    Result->DataSize = SizeFound;
    if (!EBML_ElementValidateSize(Result) || (SizeFound != SizeUnknown && MaxDataSize < (size_t)Result->DataSize))
    {
        NodeDelete((node*)Result);
        return NULL;
    }
    Result->ElementPosition = aElementPosition;
    Result->SizePosition = aSizePosition;
    Result->EndPosition = aSizePosition + _SizeLength + SizeFound;

    return Result;
}